

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O2

char * apprun_string_trim(char *str)

{
  char *pcVar1;
  char cVar2;
  ushort **ppuVar3;
  char *pcVar4;
  size_t sVar5;
  size_t __n;
  char *pcVar6;
  
  ppuVar3 = __ctype_b_loc();
  pcVar6 = str + -1;
  do {
    pcVar4 = pcVar6;
    pcVar6 = pcVar4 + 1;
  } while ((*(byte *)((long)*ppuVar3 + (long)pcVar4[1] * 2 + 1) & 0x20) != 0);
  pcVar4 = pcVar4 + -1;
  sVar5 = 0xffffffffffffffff;
  do {
    sVar5 = sVar5 + 1;
    pcVar1 = pcVar4 + 2;
    pcVar4 = pcVar4 + 1;
  } while (*pcVar1 != '\0');
  do {
    __n = sVar5;
    if (pcVar4 <= pcVar6) break;
    cVar2 = *pcVar4;
    pcVar4 = pcVar4 + -1;
    sVar5 = __n - 1;
  } while ((*(byte *)((long)*ppuVar3 + (long)cVar2 * 2 + 1) & 0x20) != 0);
  pcVar6 = strndup(pcVar6,__n);
  return pcVar6;
}

Assistant:

char *apprun_string_trim(char *str) {
    char *useful_section_start = str;

    while (isspace(*useful_section_start))
        useful_section_start++;

    char *useful_section_end = useful_section_start;
    while (*useful_section_end != '\0')
        useful_section_end++;

    while (((useful_section_end - 1) > useful_section_start) && isspace(*(useful_section_end - 1)))
        useful_section_end--;

    char *result = strndup(useful_section_start, useful_section_end - useful_section_start);
    return result;
}